

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

string * __thiscall
google::protobuf::(anonymous_namespace)::ToJsonName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,string_view input)

{
  string *psVar1;
  Nonnull<const_char_*> failure_msg;
  _anonymous_namespace_ *p_Var2;
  LogMessageFatal local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if (this != (_anonymous_namespace_ *)0x0) {
    p_Var2 = (_anonymous_namespace_ *)0x0;
    do {
      if (p_Var2[input._M_len] != (_anonymous_namespace_)0x5f) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      p_Var2 = p_Var2 + 1;
    } while (this != p_Var2);
    if (this != (_anonymous_namespace_ *)0x0) {
      p_Var2 = (_anonymous_namespace_ *)0x0;
      psVar1 = (string *)0x0;
      do {
        psVar1 = (string *)
                 ((long)&(psVar1->_M_dataplus)._M_p +
                 (ulong)(p_Var2[input._M_len] == (_anonymous_namespace_)0x5f));
        p_Var2 = p_Var2 + 1;
      } while (this != p_Var2);
      goto LAB_0016e7ba;
    }
  }
  psVar1 = (string *)0x0;
LAB_0016e7ba:
  if ((long)this - (long)psVar1 == __return_storage_ptr__->_M_string_length) {
    return psVar1;
  }
  failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                          ((long)this - (long)psVar1,__return_storage_ptr__->_M_string_length,
                           "JsonNameSize(input) == result.size()");
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
             ,0x98,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
}

Assistant:

std::string ToJsonName(const absl::string_view input) {
  bool capitalize_next = false;
  std::string result;
  result.reserve(input.size());

  for (char character : input) {
    if (character == '_') {
      capitalize_next = true;
    } else if (capitalize_next) {
      result.push_back(absl::ascii_toupper(character));
      capitalize_next = false;
    } else {
      result.push_back(character);
    }
  }

  ABSL_DCHECK_EQ(JsonNameSize(input), result.size());

  return result;
}